

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pfVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  void *pvVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    iVar6 = bottom_blob->w;
    lVar11 = 0;
    auVar20._8_4_ = 0x80000000;
    auVar20._0_8_ = 0x8000000080000000;
    auVar20._12_4_ = 0x80000000;
    auVar21._8_4_ = 0x3effffff;
    auVar21._0_8_ = 0x3effffff3effffff;
    auVar21._12_4_ = 0x3effffff;
    do {
      if (_bias == (Mat *)0x0) {
        fVar22 = 0.0;
      }
      else {
        fVar22 = *(float *)((long)&_bias->data + lVar11 * 4);
      }
      if (0 < iVar5) {
        pvVar19 = (void *)(top_blob->cstep * lVar11 * top_blob->elemsize + (long)top_blob->data);
        pfVar7 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar7[lVar11 * 2];
        fVar2 = pfVar7[lVar11 * 2 + 1];
        pvVar17 = (void *)(bottom_blob->cstep * lVar11 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar9 = lVar11 * 9;
        pvVar12 = (void *)((long)pvVar17 + (long)iVar6 * 2);
        lVar15 = (long)pvVar17 + (long)iVar6;
        iVar16 = 0;
        do {
          if (0 < iVar4) {
            lVar18 = 2;
            lVar10 = 0;
            uVar13 = iVar4 + 1;
            do {
              fVar8 = (fVar1 * (float)((int)*(char *)((long)&_kernel->refcount + lVar9) *
                                       (int)*(char *)((long)pvVar12 + lVar18) +
                                       (int)*(char *)((long)&_kernel->data + lVar9 + 7) *
                                       (int)*(char *)((long)pvVar12 + lVar18 + -1) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 6) *
                                      (int)*(char *)((long)pvVar12 + lVar18 + -2) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 5) *
                                      (int)*(char *)(lVar15 + lVar18) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 4) *
                                      (int)*(char *)(lVar15 + -1 + lVar18) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 3) *
                                      (int)*(char *)(lVar15 + -2 + lVar18) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 2) *
                                      (int)*(char *)((long)pvVar17 + lVar18) +
                                      (int)*(char *)((long)&_kernel->data + lVar9 + 1) *
                                      (int)*(char *)((long)pvVar17 + lVar18 + -1) +
                                      (int)*(char *)((long)&_kernel->data + lVar9) *
                                      (int)*(char *)((long)pvVar17 + lVar18 + -2)) + fVar22) * fVar2
              ;
              auVar23 = vandps_avx(ZEXT416((uint)fVar8),auVar20);
              auVar23 = vorps_avx(auVar23,auVar21);
              auVar23 = ZEXT416((uint)(fVar8 + auVar23._0_4_));
              auVar23 = vroundss_avx(auVar23,auVar23,0xb);
              iVar14 = (int)auVar23._0_4_;
              if (iVar14 < -0x7e) {
                iVar14 = -0x7f;
              }
              if (0x7e < iVar14) {
                iVar14 = 0x7f;
              }
              *(char *)((long)pvVar19 + lVar18 + -2) = (char)iVar14;
              uVar13 = uVar13 - 1;
              lVar10 = lVar10 + -1;
              lVar18 = lVar18 + 1;
            } while (1 < uVar13);
            pvVar12 = (void *)((long)pvVar12 - lVar10);
            lVar15 = lVar15 - lVar10;
            pvVar17 = (void *)((long)pvVar17 - lVar10);
            pvVar19 = (void *)((long)pvVar19 - lVar10);
          }
          pvVar17 = (void *)((long)pvVar17 + 2);
          lVar15 = lVar15 + 2;
          pvVar12 = (void *)((long)pvVar12 + 2);
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar5);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}